

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::QuadFillTest::QuadFillTest
          (QuadFillTest *this,Context *context,char *name,char *description,
          WindowRectangle *viewport,Vec3 *d1,Vec3 *d2,Vec3 *center_)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vector<float,_4> local_248;
  tcu local_238 [8];
  float afStack_230 [2];
  Vector<float,_4> local_228;
  tcu local_218 [8];
  float afStack_210 [2];
  Vector<float,_4> local_208;
  tcu local_1f8 [8];
  float afStack_1f0 [2];
  Vector<float,_4> local_1e8;
  tcu local_1d8 [16];
  Vector<float,_4> local_1c8;
  tcu local_1b8 [16];
  Vector<float,_4> local_1a8;
  tcu local_198 [16];
  undefined1 auStack_188 [8];
  FillTriangle triangle2;
  FillTriangle triangle1;
  Vector<float,_4> local_bc;
  undefined1 local_ac [8];
  Vec4 e2;
  undefined1 local_8c [8];
  Vec4 e1;
  Vec4 halfRed;
  Vec4 halfWhite;
  undefined1 local_4c [8];
  Vec4 center;
  float radius;
  Vec3 *d1_local;
  WindowRectangle *viewport_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  QuadFillTest *this_local;
  
  unique0x100008c5 = d1;
  TriangleFillTest::TriangleFillTest
            (&this->super_TriangleFillTest,context,name,description,viewport);
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__QuadFillTest_03280178;
  center.m_data[2] = 40000.0;
  fVar1 = tcu::Vector<float,_3>::x(center_);
  fVar2 = tcu::Vector<float,_3>::y(center_);
  fVar3 = tcu::Vector<float,_3>::z(center_);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_4c,fVar1,fVar2,fVar3,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(halfRed.m_data + 2),0.5,0.5,0.5,0.5);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(e1.m_data + 2),0.5,0.0,0.0,0.5);
  fVar1 = tcu::Vector<float,_3>::x(stack0xffffffffffffffc8);
  fVar2 = tcu::Vector<float,_3>::y(stack0xffffffffffffffc8);
  fVar3 = tcu::Vector<float,_3>::z(stack0xffffffffffffffc8);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(e2.m_data + 2),fVar1,fVar2,fVar3,0.0);
  tcu::operator*((tcu *)local_8c,40000.0,(Vector<float,_4> *)(e2.m_data + 2));
  fVar1 = tcu::Vector<float,_3>::x(d2);
  fVar2 = tcu::Vector<float,_3>::y(d2);
  fVar3 = tcu::Vector<float,_3>::z(d2);
  tcu::Vector<float,_4>::Vector(&local_bc,fVar1,fVar2,fVar3,0.0);
  tcu::operator*((tcu *)local_ac,40000.0,&local_bc);
  TriangleFillTest::FillTriangle::FillTriangle((FillTriangle *)(triangle2.c2.m_data + 2));
  TriangleFillTest::FillTriangle::FillTriangle((FillTriangle *)auStack_188);
  tcu::operator+((tcu *)&local_1a8,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator+(local_198,&local_1a8,(Vector<float,_4> *)local_ac);
  triangle2.c2.m_data._8_8_ = local_198._0_8_;
  tcu::operator+((tcu *)&local_1c8,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator-(local_1b8,&local_1c8,(Vector<float,_4> *)local_ac);
  tcu::operator-((tcu *)&local_1e8,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator-(local_1d8,&local_1e8,(Vector<float,_4> *)local_ac);
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(&(this->super_TriangleFillTest).m_triangles,(value_type *)(triangle2.c2.m_data + 2));
  triangle2.v0.m_data[2] = e1.m_data[2];
  triangle2.v0.m_data[3] = e1.m_data[3];
  triangle2.c0.m_data[0] = halfRed.m_data[0];
  triangle2.c0.m_data[1] = halfRed.m_data[1];
  triangle2.v1.m_data[2] = e1.m_data[2];
  triangle2.v1.m_data[3] = e1.m_data[3];
  triangle2.c1.m_data[0] = halfRed.m_data[0];
  triangle2.c1.m_data[1] = halfRed.m_data[1];
  triangle2.v2.m_data[2] = e1.m_data[2];
  triangle2.v2.m_data[3] = e1.m_data[3];
  triangle2.c2.m_data[0] = halfRed.m_data[0];
  triangle2.c2.m_data[1] = halfRed.m_data[1];
  tcu::operator+((tcu *)&local_208,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator+(local_1f8,&local_208,(Vector<float,_4> *)local_ac);
  auStack_188[0] = local_1f8[0];
  auStack_188[1] = local_1f8[1];
  auStack_188[2] = local_1f8[2];
  auStack_188[3] = local_1f8[3];
  auStack_188[4] = local_1f8[4];
  auStack_188[5] = local_1f8[5];
  auStack_188[6] = local_1f8[6];
  auStack_188[7] = local_1f8[7];
  triangle2.v0.m_data[0] = afStack_1f0[0];
  triangle2.v0.m_data[1] = afStack_1f0[1];
  tcu::operator-((tcu *)&local_228,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator-(local_218,&local_228,(Vector<float,_4> *)local_ac);
  triangle2.c0.m_data._8_8_ = local_218;
  triangle2.v1.m_data[0] = afStack_210[0];
  triangle2.v1.m_data[1] = afStack_210[1];
  tcu::operator-((tcu *)&local_248,(Vector<float,_4> *)local_4c,(Vector<float,_4> *)local_8c);
  tcu::operator+(local_238,&local_248,(Vector<float,_4> *)local_ac);
  triangle2.c1.m_data._8_8_ = local_238;
  triangle2.v2.m_data[0] = afStack_230[0];
  triangle2.v2.m_data[1] = afStack_230[1];
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(&(this->super_TriangleFillTest).m_triangles,(value_type *)auStack_188);
  return;
}

Assistant:

QuadFillTest::QuadFillTest (Context& context, const char* name, const char* description, const rr::WindowRectangle& viewport, const tcu::Vec3& d1, const tcu::Vec3& d2, const tcu::Vec3& center_)
	: TriangleFillTest(context, name, description, viewport)
{
	const float		radius		= 40000.0f;
	const tcu::Vec4 center		= tcu::Vec4(center_.x(), center_.y(), center_.z(), 1.0f);
	const tcu::Vec4 halfWhite	= tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
	const tcu::Vec4 halfRed		= tcu::Vec4(0.5f, 0.0f, 0.0f, 0.5f);
	const tcu::Vec4	e1			= radius * tcu::Vec4(d1.x(), d1.y(), d1.z(), 0.0f);
	const tcu::Vec4	e2			= radius * tcu::Vec4(d2.x(), d2.y(), d2.z(), 0.0f);

	FillTriangle triangle1;
	FillTriangle triangle2;

	triangle1.c0 = halfWhite;
	triangle1.c1 = halfWhite;
	triangle1.c2 = halfWhite;
	triangle1.v0 = center + e1 + e2;
	triangle1.v1 = center + e1 - e2;
	triangle1.v2 = center - e1 - e2;
	m_triangles.push_back(triangle1);

	triangle2.c0 = halfRed;
	triangle2.c1 = halfRed;
	triangle2.c2 = halfRed;
	triangle2.v0 = center + e1 + e2;
	triangle2.v1 = center - e1 - e2;
	triangle2.v2 = center - e1 + e2;
	m_triangles.push_back(triangle2);
}